

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int experimental_arenas_i_pactivep_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  ulong uVar1;
  uint uVar2;
  size_t *in_RAX;
  int iVar3;
  size_t __n;
  size_t *pactivep;
  
  iVar3 = 0x16;
  if ((oldlenp != (size_t *)0x0 && oldp != (void *)0x0) && (*oldlenp == 8)) {
    pactivep = in_RAX;
    malloc_mutex_lock((tsdn_t *)tsd,&ctl_mtx);
    if (newp == (void *)0x0 && newlen == 0) {
      uVar1 = mib[2];
      iVar3 = 0xe;
      if (((uVar1 >> 0x20 == 0) && (uVar2 = duckdb_je_narenas_total_get(), (uint)uVar1 < uVar2)) &&
         (duckdb_je_arenas[uVar1].repr != (void *)0x0)) {
        pactivep = (size_t *)((long)duckdb_je_arenas[uVar1].repr + 0x29b0);
        uVar1 = *oldlenp;
        if (uVar1 == 8) {
          *(size_t **)oldp = pactivep;
          iVar3 = 0;
        }
        else {
          __n = 8;
          if (uVar1 < 8) {
            __n = uVar1;
          }
          switchD_00916250::default(oldp,&pactivep,__n);
          *oldlenp = __n;
          iVar3 = 0x16;
        }
      }
    }
    else {
      iVar3 = 1;
    }
    ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  }
  return iVar3;
}

Assistant:

static int
experimental_arenas_i_pactivep_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	if (!config_stats) {
		return ENOENT;
	}
	if (oldp == NULL || oldlenp == NULL || *oldlenp != sizeof(size_t *)) {
		return EINVAL;
	}

	unsigned arena_ind;
	arena_t *arena;
	int ret;
	size_t *pactivep;

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);
	READONLY();
	MIB_UNSIGNED(arena_ind, 2);
	if (arena_ind < narenas_total_get() && (arena =
	    arena_get(tsd_tsdn(tsd), arena_ind, false)) != NULL) {
#if defined(JEMALLOC_GCC_ATOMIC_ATOMICS) ||				\
    defined(JEMALLOC_GCC_SYNC_ATOMICS) || defined(_MSC_VER)
		/* Expose the underlying counter for fast read. */
		pactivep = (size_t *)&(arena->pa_shard.nactive.repr);
		READ(pactivep, size_t *);
		ret = 0;
#else
		ret = EFAULT;
#endif
	} else {
		ret = EFAULT;
	}
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}